

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

int __thiscall mp::ReadError::init(ReadError *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  char *pcVar1;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  MemoryWriter w;
  BasicWriter<char> *in_stack_fffffffffffffd30;
  string *message;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string local_2a8 [8];
  allocator<char> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  int *in_stack_fffffffffffffd78;
  BasicCStringRef<char> *in_stack_fffffffffffffd80;
  BasicWriter<char> *in_stack_fffffffffffffd88;
  BasicCStringRef<char> in_stack_fffffffffffffd90;
  BasicCStringRef<char> local_268 [3];
  allocator<char> local_249;
  BasicWriter<char> local_248 [34];
  int local_20;
  int local_1c;
  ReadError *local_18;
  int local_10;
  BasicCStringRef<char> local_8;
  
  message = (string *)&stack0x00000008;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = this;
  local_8.data_ = (char *)ctx;
  local_10 = in_R8D;
  pcVar1 = fmt::BasicCStringRef<char>::c_str(&local_8);
  std::__cxx11::string::operator=((string *)&this->filename_,pcVar1);
  this->line_ = local_1c;
  this->column_ = local_20;
  alloc = &local_249;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd50,alloc);
  std::allocator<char>::~allocator(&local_249);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_268,"{}:{}:{}: ");
  fmt::BasicWriter<char>::write<fmt::BasicCStringRef<char>,int,int>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,(int *)in_stack_fffffffffffffd70);
  fmt::BasicWriter<char>::write(local_248,local_10,*(void **)message,message->_M_string_length);
  this_00 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
            fmt::BasicWriter<char>::c_str(in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  Error::SetMessage(&this->super_Error,message);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd57);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
  return extraout_EAX;
}

Assistant:

void mp::ReadError::init(fmt::CStringRef filename, int line, int column,
                         fmt::CStringRef format_str, fmt::ArgList args) {
  filename_ = filename.c_str();
  line_ = line;
  column_ = column;
  fmt::MemoryWriter w;
  w.write("{}:{}:{}: ", filename, line, column);
  w.write(format_str, args);
  SetMessage(w.c_str());
}